

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::BasicResourceSubroutine::Cleanup(BasicResourceSubroutine *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_atomic_counter_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,2,this->m_storage_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,2,this->m_buffer);
  glu::CallLogWrapper::glDeleteTextures(this_00,2,this->m_texture_buffer);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		glDeleteProgram(m_program);
		glDeleteBuffers(1, &m_atomic_counter_buffer);
		glDeleteBuffers(2, m_storage_buffer);
		glDeleteBuffers(2, m_buffer);
		glDeleteTextures(2, m_texture_buffer);
		return NO_ERROR;
	}